

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BufferLimitedLabelCase::iterate
          (BufferLimitedLabelCase *this)

{
  TestLog *pTVar1;
  bool bVar2;
  int iVar3;
  deBool dVar4;
  undefined4 extraout_var;
  undefined8 *puVar6;
  long *plVar7;
  size_t sVar8;
  NotSupportedError *this_00;
  size_type *psVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  undefined8 uVar12;
  ulong uVar13;
  undefined1 auVar14 [8];
  int outlen;
  ScopedLogSection section;
  char buffer [64];
  ScopedLogSection superSection;
  ResultCollector result;
  string local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  undefined8 local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  int local_2b4;
  string local_2b0;
  ulong *local_290;
  long local_288;
  ulong local_280 [2];
  ScopedLogSection local_270;
  undefined4 local_264;
  undefined1 local_260 [8];
  _func_int **local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250 [6];
  ios_base local_1f0 [8];
  ios_base local_1e8 [264];
  undefined8 local_e0;
  char local_d8 [60];
  uint uStack_9c;
  ScopedLogSection local_98;
  code *local_90;
  int local_88;
  ResultCollector local_80;
  long lVar5;
  
  bVar2 = isKHRDebugSupported((this->super_TestCase).m_context);
  if (!bVar2) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
               ,0x874);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_260 = (undefined1  [8])local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_80,pTVar1,(string *)local_260);
  if (local_260 != (undefined1  [8])local_250) {
    operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
  }
  local_2b4 = -1;
  local_e0 = (**(code **)(lVar5 + 0x640))(0x9117,0);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 != 0) {
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
    local_90 = glu::getErrorName;
    local_88 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b0,&local_90);
    uVar13 = 0xf;
    if (local_290 != local_280) {
      uVar13 = local_280[0];
    }
    if (uVar13 < local_2b0._M_string_length + local_288) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar12 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_2b0._M_string_length + local_288) goto LAB_013aba94;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_013aba94:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_2d8 = &local_2c8;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar10) {
      local_2c8._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_2c8._8_8_ = puVar6[3];
    }
    else {
      local_2c8._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2d0 = puVar6[1];
    *puVar6 = paVar10;
    puVar6[1] = 0;
    paVar10->_M_local_buf[0] = '\0';
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar7[3];
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar10) {
      local_250[0]._0_8_ = paVar10->_M_allocated_capacity;
      local_250[0]._8_8_ = puVar6[3];
      local_260 = (undefined1  [8])local_250;
    }
    else {
      local_250[0]._0_8_ = paVar10->_M_allocated_capacity;
      local_260 = (undefined1  [8])*puVar6;
    }
    local_258 = (_func_int **)puVar6[1];
    *puVar6 = paVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_260);
    if (local_260 != (undefined1  [8])local_250) {
      operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
  }
  local_264 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 != 0) {
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
    local_90 = glu::getErrorName;
    local_88 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b0,&local_90);
    uVar13 = 0xf;
    if (local_290 != local_280) {
      uVar13 = local_280[0];
    }
    if (uVar13 < local_2b0._M_string_length + local_288) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar12 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_2b0._M_string_length + local_288) goto LAB_013abce6;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_013abce6:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_2d8 = &local_2c8;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar10) {
      local_2c8._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_2c8._8_8_ = puVar6[3];
    }
    else {
      local_2c8._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2d0 = puVar6[1];
    *puVar6 = paVar10;
    puVar6[1] = 0;
    paVar10->_M_local_buf[0] = '\0';
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar7[3];
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar10) {
      local_250[0]._0_8_ = paVar10->_M_allocated_capacity;
      local_250[0]._8_8_ = puVar6[3];
      local_260 = (undefined1  [8])local_250;
    }
    else {
      local_250[0]._0_8_ = paVar10->_M_allocated_capacity;
      local_260 = (undefined1  [8])*puVar6;
    }
    local_258 = (_func_int **)puVar6[1];
    *puVar6 = paVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_260);
    if (local_260 != (undefined1  [8])local_250) {
      operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
  }
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_260 = (undefined1  [8])local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"Shader","");
  paVar10 = &local_2f8.field_2;
  local_2f8._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Shader object","");
  tcu::ScopedLogSection::ScopedLogSection(&local_98,pTVar1,(string *)local_260,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar10) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_260 != (undefined1  [8])local_250) {
    operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
  }
  local_260 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258,"Setting label to string: \"",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258,"This is a debug label",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"\"",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  (**(code **)(lVar5 + 0xfc0))(0x82e1,local_264,0xffffffff,"This is a debug label");
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 != 0) {
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
    local_90 = glu::getErrorName;
    local_88 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b0,&local_90);
    uVar13 = 0xf;
    if (local_290 != local_280) {
      uVar13 = local_280[0];
    }
    if (uVar13 < local_2b0._M_string_length + local_288) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar12 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_2b0._M_string_length + local_288) goto LAB_013ac063;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_013ac063:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_2d8 = &local_2c8;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar11) {
      local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2c8._8_8_ = puVar6[3];
    }
    else {
      local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2d0 = puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    paVar11->_M_local_buf[0] = '\0';
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar7[3];
      local_2f8._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar11) {
      local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_250[0]._8_8_ = puVar6[3];
      local_260 = (undefined1  [8])local_250;
    }
    else {
      local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_260 = (undefined1  [8])*puVar6;
    }
    local_258 = (_func_int **)puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_260);
    if (local_260 != (undefined1  [8])local_250) {
      operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar10) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
  }
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_260 = (undefined1  [8])local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"QueryAll","");
  local_2f8._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Query All","");
  tcu::ScopedLogSection::ScopedLogSection(&local_270,pTVar1,(string *)local_260,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar10) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_260 != (undefined1  [8])local_250) {
    operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
  }
  local_260 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258,"Querying whole label, buffer size = 22",0x26);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  builtin_strncpy(local_d8,"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",0x3c);
  uStack_9c = 0x58585858;
  (**(code **)(lVar5 + 0x958))(0x82e1,local_264,0x16,&local_2b4);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 != 0) {
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
    local_90 = glu::getErrorName;
    local_88 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b0,&local_90);
    uVar13 = 0xf;
    if (local_290 != local_280) {
      uVar13 = local_280[0];
    }
    if (uVar13 < local_2b0._M_string_length + local_288) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar12 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_2b0._M_string_length + local_288) goto LAB_013ac3ca;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_013ac3ca:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_2d8 = &local_2c8;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar11) {
      local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2c8._8_8_ = puVar6[3];
    }
    else {
      local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2d0 = puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    paVar11->_M_local_buf[0] = '\0';
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar7[3];
      local_2f8._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar11) {
      local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_250[0]._8_8_ = puVar6[3];
      local_260 = (undefined1  [8])local_250;
    }
    else {
      local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_260 = (undefined1  [8])*puVar6;
    }
    local_258 = (_func_int **)puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_260);
    if (local_260 != (undefined1  [8])local_250) {
      operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar10) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
  }
  if (local_2b4 == 0x15) {
    if (local_d8[0x15] == '\0') {
      if (local_d8[0x16] == 'X') {
        dVar4 = deStringEqual("This is a debug label",local_d8);
        if (dVar4 != 0) {
          local_260 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_258,"Query returned string: \"",0x18);
          sVar8 = strlen(local_d8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,local_d8,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"\"",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
          std::ios_base::~ios_base(local_1e8);
          goto LAB_013ac89d;
        }
        uStack_9c = uStack_9c & 0xffffff;
        local_260 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_258,"Query returned string: \"",0x18);
        sVar8 = strlen(local_d8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,local_d8,sVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"\"",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
        std::ios_base::~ios_base(local_1e8);
        local_260 = (undefined1  [8])local_250;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_260,"Query returned wrong label","");
        tcu::ResultCollector::fail(&local_80,(string *)local_260);
      }
      else {
        local_260 = (undefined1  [8])local_250;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_260,"Query wrote over buffer bound","");
        tcu::ResultCollector::fail(&local_80,(string *)local_260);
      }
    }
    else {
      local_260 = (undefined1  [8])local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,"Buffer was not null-terminated","");
      tcu::ResultCollector::fail(&local_80,(string *)local_260);
    }
    uVar12 = local_250[0]._M_allocated_capacity;
    auVar14 = local_260;
    if (local_260 != (undefined1  [8])local_250) {
LAB_013ac895:
      operator_delete((void *)auVar14,uVar12 + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
    std::ostream::operator<<(local_260,local_2b4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
    std::ios_base::~ios_base(local_1f0);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x1c2cedb);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar7[3];
      local_2f8._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,&local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar10) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    uVar12 = local_2c8._M_allocated_capacity;
    auVar14 = (undefined1  [8])local_2d8;
    if (local_2d8 != &local_2c8) goto LAB_013ac895;
  }
LAB_013ac89d:
  tcu::TestLog::endSection(local_270.m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_260 = (undefined1  [8])local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"QueryAllNoSize","");
  local_2f8._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Query all without size","");
  tcu::ScopedLogSection::ScopedLogSection(&local_270,pTVar1,(string *)local_260,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar10) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_260 != (undefined1  [8])local_250) {
    operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
  }
  local_260 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258,"Querying whole label, buffer size = 22",0x26);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  builtin_strncpy(local_d8,"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",0x3c);
  uStack_9c = 0x58585858;
  (**(code **)(lVar5 + 0x958))(0x82e1,local_264,0x16,0);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 != 0) {
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
    local_90 = glu::getErrorName;
    local_88 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b0,&local_90);
    uVar13 = 0xf;
    if (local_290 != local_280) {
      uVar13 = local_280[0];
    }
    if (uVar13 < local_2b0._M_string_length + local_288) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar12 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_2b0._M_string_length + local_288) goto LAB_013aca6c;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_013aca6c:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_2d8 = &local_2c8;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar11) {
      local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2c8._8_8_ = puVar6[3];
    }
    else {
      local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2d0 = puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    paVar11->_M_local_buf[0] = '\0';
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar7[3];
      local_2f8._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar11) {
      local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_250[0]._8_8_ = puVar6[3];
      local_260 = (undefined1  [8])local_250;
    }
    else {
      local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_260 = (undefined1  [8])*puVar6;
    }
    local_258 = (_func_int **)puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_260);
    if (local_260 != (undefined1  [8])local_250) {
      operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar10) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
  }
  uStack_9c = uStack_9c & 0xffffff;
  sVar8 = strlen(local_d8);
  if (sVar8 == 0x15) {
    if (local_d8[0x15] != '\0') {
      local_260 = (undefined1  [8])local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,"Buffer was not null-terminated","");
      tcu::ResultCollector::fail(&local_80,(string *)local_260);
      goto LAB_013acc9b;
    }
    if (local_d8[0x16] != 'X') {
      local_260 = (undefined1  [8])local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,"Query wrote over buffer bound","");
      tcu::ResultCollector::fail(&local_80,(string *)local_260);
      goto LAB_013acc9b;
    }
    dVar4 = deStringEqual("This is a debug label",local_d8);
    if (dVar4 == 0) {
      local_260 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_258,"Query returned string: \"",0x18);
      sVar8 = strlen(local_d8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,local_d8,sVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"\"",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
      std::ios_base::~ios_base(local_1e8);
      local_260 = (undefined1  [8])local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,"Query returned wrong label","");
      tcu::ResultCollector::fail(&local_80,(string *)local_260);
      goto LAB_013acc9b;
    }
    local_260 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_258,"Query returned string: \"",0x18);
    sVar8 = strlen(local_d8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,local_d8,sVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"\"",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
    std::ios_base::~ios_base(local_1e8);
  }
  else {
    local_260 = (undefined1  [8])local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_260,"Buffer length was not 21","");
    tcu::ResultCollector::fail(&local_80,(string *)local_260);
LAB_013acc9b:
    if (local_260 != (undefined1  [8])local_250) {
      operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
    }
  }
  tcu::TestLog::endSection(local_270.m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_260 = (undefined1  [8])local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"QueryLess","");
  local_2f8._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Query substring","");
  tcu::ScopedLogSection::ScopedLogSection(&local_270,pTVar1,(string *)local_260,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar10) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_260 != (undefined1  [8])local_250) {
    operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
  }
  local_260 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258,"Querying whole label, buffer size = 2",0x25);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  builtin_strncpy(local_d8,"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",0x3c);
  uStack_9c = 0x58585858;
  (**(code **)(lVar5 + 0x958))(0x82e1,local_264,2,&local_2b4);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 != 0) {
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
    local_90 = glu::getErrorName;
    local_88 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b0,&local_90);
    uVar13 = 0xf;
    if (local_290 != local_280) {
      uVar13 = local_280[0];
    }
    if (uVar13 < local_2b0._M_string_length + local_288) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar12 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_2b0._M_string_length + local_288) goto LAB_013ace8e;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_013ace8e:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_2d8 = &local_2c8;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar11) {
      local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2c8._8_8_ = puVar6[3];
    }
    else {
      local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2d0 = puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    paVar11->_M_local_buf[0] = '\0';
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar7[3];
      local_2f8._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar11) {
      local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_250[0]._8_8_ = puVar6[3];
      local_260 = (undefined1  [8])local_250;
    }
    else {
      local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_260 = (undefined1  [8])*puVar6;
    }
    local_258 = (_func_int **)puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_260);
    if (local_260 != (undefined1  [8])local_250) {
      operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar10) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
  }
  if (local_2b4 == 1) {
    if (local_d8[1] == '\0') {
      if (local_d8[2] == 'X') {
        dVar4 = deStringBeginsWith("This is a debug label",local_d8);
        if (dVar4 != 0) {
          local_260 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_258,"Query returned string: \"",0x18);
          sVar8 = strlen(local_d8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,local_d8,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"\"",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
          std::ios_base::~ios_base(local_1e8);
          goto LAB_013ad534;
        }
        uStack_9c = uStack_9c & 0xffffff;
        local_260 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_258,"Query returned string: \"",0x18);
        sVar8 = strlen(local_d8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,local_d8,sVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"\"",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
        std::ios_base::~ios_base(local_1e8);
        local_260 = (undefined1  [8])local_250;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_260,"Query returned wrong label","");
        tcu::ResultCollector::fail(&local_80,(string *)local_260);
      }
      else {
        local_260 = (undefined1  [8])local_250;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_260,"Query wrote over buffer bound","");
        tcu::ResultCollector::fail(&local_80,(string *)local_260);
      }
    }
    else {
      local_260 = (undefined1  [8])local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,"Buffer was not null-terminated","");
      tcu::ResultCollector::fail(&local_80,(string *)local_260);
    }
    uVar12 = local_250[0]._M_allocated_capacity;
    auVar14 = local_260;
    if (local_260 != (undefined1  [8])local_250) {
LAB_013ad52c:
      operator_delete((void *)auVar14,uVar12 + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
    std::ostream::operator<<(local_260,local_2b4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
    std::ios_base::~ios_base(local_1f0);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x1c2cfb1);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar7[3];
      local_2f8._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,&local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar10) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    uVar12 = local_2c8._M_allocated_capacity;
    auVar14 = (undefined1  [8])local_2d8;
    if (local_2d8 != &local_2c8) goto LAB_013ad52c;
  }
LAB_013ad534:
  tcu::TestLog::endSection(local_270.m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_260 = (undefined1  [8])local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"QueryNone","");
  local_2f8._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Query one character","");
  tcu::ScopedLogSection::ScopedLogSection(&local_270,pTVar1,(string *)local_260,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar10) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_260 != (undefined1  [8])local_250) {
    operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
  }
  local_260 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258,"Querying whole label, buffer size = 1",0x25);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  builtin_strncpy(local_d8,"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",0x3c);
  uStack_9c = 0x58585858;
  (**(code **)(lVar5 + 0x958))(0x82e1,local_264,1,&local_2b4);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 != 0) {
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
    local_90 = glu::getErrorName;
    local_88 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b0,&local_90);
    uVar13 = 0xf;
    if (local_290 != local_280) {
      uVar13 = local_280[0];
    }
    if (uVar13 < local_2b0._M_string_length + local_288) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar12 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_2b0._M_string_length + local_288) goto LAB_013ad706;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_013ad706:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_2d8 = &local_2c8;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar11) {
      local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2c8._8_8_ = puVar6[3];
    }
    else {
      local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2d0 = puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    paVar11->_M_local_buf[0] = '\0';
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar7[3];
      local_2f8._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar11) {
      local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_250[0]._8_8_ = puVar6[3];
      local_260 = (undefined1  [8])local_250;
    }
    else {
      local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_260 = (undefined1  [8])*puVar6;
    }
    local_258 = (_func_int **)puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_260);
    if (local_260 != (undefined1  [8])local_250) {
      operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar10) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
  }
  if (local_2b4 == 0) {
    if (local_d8[0] == '\0') {
      if (local_d8[1] == 'X') {
        local_260 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_258,"Query returned zero-sized null-terminated string",0x30);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
        std::ios_base::~ios_base(local_1e8);
        goto LAB_013adaa3;
      }
      local_260 = (undefined1  [8])local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,"Query wrote over buffer bound","");
      tcu::ResultCollector::fail(&local_80,(string *)local_260);
    }
    else {
      local_260 = (undefined1  [8])local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,"Buffer was not null-terminated","");
      tcu::ResultCollector::fail(&local_80,(string *)local_260);
    }
    uVar12 = local_250[0]._M_allocated_capacity;
    auVar14 = local_260;
    if (local_260 != (undefined1  [8])local_250) goto LAB_013ada9b;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
    std::ostream::operator<<(local_260,local_2b4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
    std::ios_base::~ios_base(local_1f0);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x1c2d004);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar7[3];
      local_2f8._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,&local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar10) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    uVar12 = local_2c8._M_allocated_capacity;
    auVar14 = (undefined1  [8])local_2d8;
    if (local_2d8 != &local_2c8) {
LAB_013ada9b:
      operator_delete((void *)auVar14,uVar12 + 1);
    }
  }
LAB_013adaa3:
  tcu::TestLog::endSection(local_270.m_log);
  tcu::TestLog::endSection(local_98.m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_260 = (undefined1  [8])local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"Sync","");
  local_2f8._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Sync object","");
  tcu::ScopedLogSection::ScopedLogSection(&local_98,pTVar1,(string *)local_260,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar10) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_260 != (undefined1  [8])local_250) {
    operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
  }
  local_260 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258,"Setting label to string: \"",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258,"This is a debug label",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"\"",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  (**(code **)(lVar5 + 0xfc8))(local_e0,0xffffffff,"This is a debug label");
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 != 0) {
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
    local_90 = glu::getErrorName;
    local_88 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b0,&local_90);
    uVar13 = 0xf;
    if (local_290 != local_280) {
      uVar13 = local_280[0];
    }
    if (uVar13 < local_2b0._M_string_length + local_288) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar12 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_2b0._M_string_length + local_288) goto LAB_013adc86;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_013adc86:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_2d8 = &local_2c8;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar11) {
      local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2c8._8_8_ = puVar6[3];
    }
    else {
      local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2d0 = puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    paVar11->_M_local_buf[0] = '\0';
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar7[3];
      local_2f8._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar11) {
      local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_250[0]._8_8_ = puVar6[3];
      local_260 = (undefined1  [8])local_250;
    }
    else {
      local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_260 = (undefined1  [8])*puVar6;
    }
    local_258 = (_func_int **)puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_260);
    if (local_260 != (undefined1  [8])local_250) {
      operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar10) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
  }
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_260 = (undefined1  [8])local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"QueryAll","");
  local_2f8._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Query All","");
  tcu::ScopedLogSection::ScopedLogSection(&local_270,pTVar1,(string *)local_260,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar10) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_260 != (undefined1  [8])local_250) {
    operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
  }
  local_260 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258,"Querying whole label, buffer size = 22",0x26);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  builtin_strncpy(local_d8,"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",0x3c);
  uStack_9c = 0x58585858;
  (**(code **)(lVar5 + 0x960))(local_e0,0x16,&local_2b4);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 != 0) {
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
    local_90 = glu::getErrorName;
    local_88 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b0,&local_90);
    uVar13 = 0xf;
    if (local_290 != local_280) {
      uVar13 = local_280[0];
    }
    if (uVar13 < local_2b0._M_string_length + local_288) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar12 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_2b0._M_string_length + local_288) goto LAB_013adfe5;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_013adfe5:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_2d8 = &local_2c8;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar11) {
      local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2c8._8_8_ = puVar6[3];
    }
    else {
      local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2d0 = puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    paVar11->_M_local_buf[0] = '\0';
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar7[3];
      local_2f8._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar11) {
      local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_250[0]._8_8_ = puVar6[3];
      local_260 = (undefined1  [8])local_250;
    }
    else {
      local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_260 = (undefined1  [8])*puVar6;
    }
    local_258 = (_func_int **)puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_260);
    if (local_260 != (undefined1  [8])local_250) {
      operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar10) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
  }
  if (local_2b4 == 0x15) {
    if (local_d8[0x15] == '\0') {
      if (local_d8[0x16] == 'X') {
        dVar4 = deStringEqual("This is a debug label",local_d8);
        if (dVar4 != 0) {
          local_260 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_258,"Query returned string: \"",0x18);
          sVar8 = strlen(local_d8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,local_d8,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"\"",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
          std::ios_base::~ios_base(local_1e8);
          goto LAB_013ae4b8;
        }
        uStack_9c = uStack_9c & 0xffffff;
        local_260 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_258,"Query returned string: \"",0x18);
        sVar8 = strlen(local_d8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,local_d8,sVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"\"",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
        std::ios_base::~ios_base(local_1e8);
        local_260 = (undefined1  [8])local_250;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_260,"Query returned wrong label","");
        tcu::ResultCollector::fail(&local_80,(string *)local_260);
      }
      else {
        local_260 = (undefined1  [8])local_250;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_260,"Query wrote over buffer bound","");
        tcu::ResultCollector::fail(&local_80,(string *)local_260);
      }
    }
    else {
      local_260 = (undefined1  [8])local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,"Buffer was not null-terminated","");
      tcu::ResultCollector::fail(&local_80,(string *)local_260);
    }
    uVar12 = local_250[0]._M_allocated_capacity;
    auVar14 = local_260;
    if (local_260 != (undefined1  [8])local_250) {
LAB_013ae4b0:
      operator_delete((void *)auVar14,uVar12 + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
    std::ostream::operator<<(local_260,local_2b4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
    std::ios_base::~ios_base(local_1f0);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x1c2cedb);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar7[3];
      local_2f8._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,&local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar10) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    uVar12 = local_2c8._M_allocated_capacity;
    auVar14 = (undefined1  [8])local_2d8;
    if (local_2d8 != &local_2c8) goto LAB_013ae4b0;
  }
LAB_013ae4b8:
  tcu::TestLog::endSection(local_270.m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_260 = (undefined1  [8])local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"QueryAllNoSize","");
  local_2f8._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Query all without size","");
  tcu::ScopedLogSection::ScopedLogSection(&local_270,pTVar1,(string *)local_260,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar10) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_260 != (undefined1  [8])local_250) {
    operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
  }
  local_260 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258,"Querying whole label, buffer size = 22",0x26);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  builtin_strncpy(local_d8,"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",0x3c);
  uStack_9c = 0x58585858;
  (**(code **)(lVar5 + 0x960))(local_e0,0x16,0);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 != 0) {
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
    local_90 = glu::getErrorName;
    local_88 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b0,&local_90);
    uVar13 = 0xf;
    if (local_290 != local_280) {
      uVar13 = local_280[0];
    }
    if (uVar13 < local_2b0._M_string_length + local_288) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar12 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_2b0._M_string_length + local_288) goto LAB_013ae67f;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_013ae67f:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_2d8 = &local_2c8;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar11) {
      local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2c8._8_8_ = puVar6[3];
    }
    else {
      local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2d0 = puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    paVar11->_M_local_buf[0] = '\0';
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar7[3];
      local_2f8._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar11) {
      local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_250[0]._8_8_ = puVar6[3];
      local_260 = (undefined1  [8])local_250;
    }
    else {
      local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_260 = (undefined1  [8])*puVar6;
    }
    local_258 = (_func_int **)puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_260);
    if (local_260 != (undefined1  [8])local_250) {
      operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar10) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
  }
  uStack_9c = uStack_9c & 0xffffff;
  sVar8 = strlen(local_d8);
  if (sVar8 == 0x15) {
    if (local_d8[0x15] != '\0') {
      local_260 = (undefined1  [8])local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,"Buffer was not null-terminated","");
      tcu::ResultCollector::fail(&local_80,(string *)local_260);
      goto LAB_013ae8ae;
    }
    if (local_d8[0x16] != 'X') {
      local_260 = (undefined1  [8])local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,"Query wrote over buffer bound","");
      tcu::ResultCollector::fail(&local_80,(string *)local_260);
      goto LAB_013ae8ae;
    }
    dVar4 = deStringEqual("This is a debug label",local_d8);
    if (dVar4 == 0) {
      local_260 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_258,"Query returned string: \"",0x18);
      sVar8 = strlen(local_d8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,local_d8,sVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"\"",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
      std::ios_base::~ios_base(local_1e8);
      local_260 = (undefined1  [8])local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,"Query returned wrong label","");
      tcu::ResultCollector::fail(&local_80,(string *)local_260);
      goto LAB_013ae8ae;
    }
    local_260 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_258,"Query returned string: \"",0x18);
    sVar8 = strlen(local_d8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,local_d8,sVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"\"",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
    std::ios_base::~ios_base(local_1e8);
  }
  else {
    local_260 = (undefined1  [8])local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_260,"Buffer length was not 21","");
    tcu::ResultCollector::fail(&local_80,(string *)local_260);
LAB_013ae8ae:
    if (local_260 != (undefined1  [8])local_250) {
      operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
    }
  }
  tcu::TestLog::endSection(local_270.m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_260 = (undefined1  [8])local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"QueryLess","");
  local_2f8._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Query substring","");
  tcu::ScopedLogSection::ScopedLogSection(&local_270,pTVar1,(string *)local_260,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar10) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_260 != (undefined1  [8])local_250) {
    operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
  }
  local_260 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258,"Querying whole label, buffer size = 2",0x25);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  builtin_strncpy(local_d8,"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",0x3c);
  uStack_9c = 0x58585858;
  (**(code **)(lVar5 + 0x960))(local_e0,2,&local_2b4);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 != 0) {
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
    local_90 = glu::getErrorName;
    local_88 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b0,&local_90);
    uVar13 = 0xf;
    if (local_290 != local_280) {
      uVar13 = local_280[0];
    }
    if (uVar13 < local_2b0._M_string_length + local_288) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar12 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_2b0._M_string_length + local_288) goto LAB_013aea99;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_013aea99:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_2d8 = &local_2c8;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar11) {
      local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2c8._8_8_ = puVar6[3];
    }
    else {
      local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2d0 = puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    paVar11->_M_local_buf[0] = '\0';
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar7[3];
      local_2f8._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar11) {
      local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_250[0]._8_8_ = puVar6[3];
      local_260 = (undefined1  [8])local_250;
    }
    else {
      local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_260 = (undefined1  [8])*puVar6;
    }
    local_258 = (_func_int **)puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_260);
    if (local_260 != (undefined1  [8])local_250) {
      operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar10) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
  }
  if (local_2b4 == 1) {
    if (local_d8[1] == '\0') {
      if (local_d8[2] == 'X') {
        dVar4 = deStringBeginsWith("This is a debug label",local_d8);
        if (dVar4 != 0) {
          local_260 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_258,"Query returned string: \"",0x18);
          sVar8 = strlen(local_d8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,local_d8,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"\"",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
          std::ios_base::~ios_base(local_1e8);
          goto LAB_013af13f;
        }
        uStack_9c = uStack_9c & 0xffffff;
        local_260 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_258,"Query returned string: \"",0x18);
        sVar8 = strlen(local_d8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,local_d8,sVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"\"",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
        std::ios_base::~ios_base(local_1e8);
        local_260 = (undefined1  [8])local_250;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_260,"Query returned wrong label","");
        tcu::ResultCollector::fail(&local_80,(string *)local_260);
      }
      else {
        local_260 = (undefined1  [8])local_250;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_260,"Query wrote over buffer bound","");
        tcu::ResultCollector::fail(&local_80,(string *)local_260);
      }
    }
    else {
      local_260 = (undefined1  [8])local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,"Buffer was not null-terminated","");
      tcu::ResultCollector::fail(&local_80,(string *)local_260);
    }
    uVar12 = local_250[0]._M_allocated_capacity;
    auVar14 = local_260;
    if (local_260 != (undefined1  [8])local_250) {
LAB_013af137:
      operator_delete((void *)auVar14,uVar12 + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
    std::ostream::operator<<(local_260,local_2b4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
    std::ios_base::~ios_base(local_1f0);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x1c2cfb1);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar7[3];
      local_2f8._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,&local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar10) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    uVar12 = local_2c8._M_allocated_capacity;
    auVar14 = (undefined1  [8])local_2d8;
    if (local_2d8 != &local_2c8) goto LAB_013af137;
  }
LAB_013af13f:
  tcu::TestLog::endSection(local_270.m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_260 = (undefined1  [8])local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"QueryNone","");
  local_2f8._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Query one character","");
  tcu::ScopedLogSection::ScopedLogSection(&local_270,pTVar1,(string *)local_260,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar10) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_260 != (undefined1  [8])local_250) {
    operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
  }
  local_260 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258,"Querying whole label, buffer size = 1",0x25);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  builtin_strncpy(local_d8,"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",0x3c);
  uStack_9c = 0x58585858;
  (**(code **)(lVar5 + 0x960))(local_e0,1,&local_2b4);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 != 0) {
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Got Error ","");
    local_90 = glu::getErrorName;
    local_88 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b0,&local_90);
    uVar13 = 0xf;
    if (local_290 != local_280) {
      uVar13 = local_280[0];
    }
    if (uVar13 < local_2b0._M_string_length + local_288) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar12 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_2b0._M_string_length + local_288) goto LAB_013af309;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_013af309:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_2d8 = &local_2c8;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar11) {
      local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2c8._8_8_ = puVar6[3];
    }
    else {
      local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2d0 = puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    paVar11->_M_local_buf[0] = '\0';
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar7[3];
      local_2f8._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar11) {
      local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_250[0]._8_8_ = puVar6[3];
      local_260 = (undefined1  [8])local_250;
    }
    else {
      local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_260 = (undefined1  [8])*puVar6;
    }
    local_258 = (_func_int **)puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_260);
    if (local_260 != (undefined1  [8])local_250) {
      operator_delete((void *)local_260,local_250[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar10) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
  }
  if (local_2b4 == 0) {
    if (local_d8[0] == '\0') {
      if (local_d8[1] == 'X') {
        local_260 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_258,"Query returned zero-sized null-terminated string",0x30);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
        std::ios_base::~ios_base(local_1e8);
        goto LAB_013af6a6;
      }
      local_260 = (undefined1  [8])local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,"Query wrote over buffer bound","");
      tcu::ResultCollector::fail(&local_80,(string *)local_260);
    }
    else {
      local_260 = (undefined1  [8])local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,"Buffer was not null-terminated","");
      tcu::ResultCollector::fail(&local_80,(string *)local_260);
    }
    uVar12 = local_250[0]._M_allocated_capacity;
    auVar14 = local_260;
    if (local_260 == (undefined1  [8])local_250) goto LAB_013af6a6;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
    std::ostream::operator<<(local_260,local_2b4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
    std::ios_base::~ios_base(local_1f0);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x1c2d004);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar7[3];
      local_2f8._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,&local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar10) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    uVar12 = local_2c8._M_allocated_capacity;
    auVar14 = (undefined1  [8])local_2d8;
    if (local_2d8 == &local_2c8) goto LAB_013af6a6;
  }
  operator_delete((void *)auVar14,uVar12 + 1);
LAB_013af6a6:
  tcu::TestLog::endSection(local_270.m_log);
  tcu::TestLog::endSection(local_98.m_log);
  (**(code **)(lVar5 + 0x470))(local_264);
  (**(code **)(lVar5 + 0x478))(local_e0);
  tcu::ResultCollector::setTestContextResult
            (&local_80,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

BufferLimitedLabelCase::IterateResult BufferLimitedLabelCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	const char*	const		msg			= "This is a debug label";
	int						outlen		= -1;
	GLuint					shader;
	glw::GLsync				sync;
	char					buffer[64];

	sync = gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "fenceSync");

	shader = gl.createShader(GL_FRAGMENT_SHADER);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "createShader");

	{
		const tcu::ScopedLogSection superSection(m_testCtx.getLog(), "Shader", "Shader object");

		m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\"" << TestLog::EndMessage;
		gl.objectLabel(GL_SHADER, shader, -1, msg);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryAll", "Query All");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 22" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectLabel(GL_SHADER, shader, 22, &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

			if (outlen != 21)
				result.fail("'length' was not 21, got " + de::toString(outlen));
			else if (buffer[outlen] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[outlen+1] != 'X')
				result.fail("Query wrote over buffer bound");
			else if (!deStringEqual(msg, buffer))
			{
				buffer[63] = '\0'; // make sure buffer is null terminated before printing
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
				result.fail("Query returned wrong label");
			}
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryAllNoSize", "Query all without size");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 22" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectLabel(GL_SHADER, shader, 22, DE_NULL, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

			buffer[63] = '\0'; // make sure buffer is null terminated before strlen

			if (strlen(buffer) != 21)
				result.fail("Buffer length was not 21");
			else if (buffer[21] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[22] != 'X')
				result.fail("Query wrote over buffer bound");
			else if (!deStringEqual(msg, buffer))
			{
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
				result.fail("Query returned wrong label");
			}
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryLess", "Query substring");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 2" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectLabel(GL_SHADER, shader, 2, &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

			if (outlen != 1)
				result.fail("'length' was not 1, got " + de::toString(outlen));
			else if (buffer[outlen] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[outlen+1] != 'X')
				result.fail("Query wrote over buffer bound");
			else if (!deStringBeginsWith(msg, buffer))
			{
				buffer[63] = '\0'; // make sure buffer is null terminated before printing
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
				result.fail("Query returned wrong label");
			}
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryNone", "Query one character");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 1" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectLabel(GL_SHADER, shader, 1, &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

			if (outlen != 0)
				result.fail("'length' was not 0, got " + de::toString(outlen));
			else if (buffer[outlen] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[outlen+1] != 'X')
				result.fail("Query wrote over buffer bound");
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned zero-sized null-terminated string" << TestLog::EndMessage;
		}
	}

	{
		const tcu::ScopedLogSection superSection(m_testCtx.getLog(), "Sync", "Sync object");

		m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\"" << TestLog::EndMessage;
		gl.objectPtrLabel(sync, -1, msg);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryAll", "Query All");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 22" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectPtrLabel(sync, 22, &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

			if (outlen != 21)
				result.fail("'length' was not 21, got " + de::toString(outlen));
			else if (buffer[outlen] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[outlen+1] != 'X')
				result.fail("Query wrote over buffer bound");
			else if (!deStringEqual(msg, buffer))
			{
				buffer[63] = '\0'; // make sure buffer is null terminated before printing
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
				result.fail("Query returned wrong label");
			}
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryAllNoSize", "Query all without size");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 22" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectPtrLabel(sync, 22, DE_NULL, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

			buffer[63] = '\0'; // make sure buffer is null terminated before strlen

			if (strlen(buffer) != 21)
				result.fail("Buffer length was not 21");
			else if (buffer[21] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[22] != 'X')
				result.fail("Query wrote over buffer bound");
			else if (!deStringEqual(msg, buffer))
			{
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
				result.fail("Query returned wrong label");
			}
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryLess", "Query substring");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 2" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectPtrLabel(sync, 2, &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

			if (outlen != 1)
				result.fail("'length' was not 1, got " + de::toString(outlen));
			else if (buffer[outlen] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[outlen+1] != 'X')
				result.fail("Query wrote over buffer bound");
			else if (!deStringBeginsWith(msg, buffer))
			{
				buffer[63] = '\0'; // make sure buffer is null terminated before printing
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
				result.fail("Query returned wrong label");
			}
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryNone", "Query one character");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 1" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectPtrLabel(sync, 1, &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

			if (outlen != 0)
				result.fail("'length' was not 0, got " + de::toString(outlen));
			else if (buffer[outlen] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[outlen+1] != 'X')
				result.fail("Query wrote over buffer bound");
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned zero-sized null-terminated string" << TestLog::EndMessage;
		}
	}

	gl.deleteShader(shader);
	gl.deleteSync(sync);

	result.setTestContextResult(m_testCtx);
	return STOP;
}